

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomicops_internals_x86_gcc.h
# Opt level: O1

uint64 __thiscall google::protobuf::Arena::Reset(Arena *this)

{
  long lVar1;
  uint64 uVar2;
  
  LOCK();
  UNLOCK();
  lVar1 = lifecycle_id_generator_ + 1;
  *(long *)this = lifecycle_id_generator_;
  lifecycle_id_generator_ = lVar1;
  uVar2 = ResetInternal(this);
  return uVar2;
}

Assistant:

inline Atomic64 NoBarrier_AtomicIncrement(volatile Atomic64* ptr,
                                          Atomic64 increment) {
  Atomic64 temp = increment;
  __asm__ __volatile__("lock; xaddq %0,%1"
                       : "+r" (temp), "+m" (*ptr)
                       : : "memory");
  // temp now contains the previous value of *ptr
  return temp + increment;
}